

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O3

void __thiscall
Fl_Simple_Counter::Fl_Simple_Counter(Fl_Simple_Counter *this,int X,int Y,int W,int H,char *L)

{
  Fl_Valuator::Fl_Valuator((Fl_Valuator *)this,X,Y,W,H,L);
  (this->super_Fl_Counter).super_Fl_Valuator.super_Fl_Widget.box_ = '\x02';
  (this->super_Fl_Counter).super_Fl_Valuator.super_Fl_Widget.color2_ = 8;
  (this->super_Fl_Counter).super_Fl_Valuator.super_Fl_Widget.label_.align_ = 2;
  (this->super_Fl_Counter).super_Fl_Valuator.min = -1000000.0;
  (this->super_Fl_Counter).super_Fl_Valuator.max = 1000000.0;
  (this->super_Fl_Counter).super_Fl_Valuator.A = 1.0;
  *(undefined8 *)&(this->super_Fl_Counter).super_Fl_Valuator.B = 10;
  (this->super_Fl_Counter).lstep_ = 1.0;
  (this->super_Fl_Counter).mouseobj = '\0';
  (this->super_Fl_Counter).textsize_ = FL_NORMAL_SIZE;
  (this->super_Fl_Counter).textcolor_ = 0;
  (this->super_Fl_Counter).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Counter_00277170;
  (this->super_Fl_Counter).super_Fl_Valuator.super_Fl_Widget.type_ = '\x01';
  return;
}

Assistant:

Fl_Simple_Counter::Fl_Simple_Counter(int X,int Y,int W,int H, const char *L)
: Fl_Counter(X,Y,W,H,L) {
  type(FL_SIMPLE_COUNTER);
}